

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlStreamPop(xmlStreamCtxtPtr stream)

{
  int iVar1;
  long lVar2;
  
  if (stream == (xmlStreamCtxtPtr)0x0) {
    return -1;
  }
  do {
    iVar1 = stream->level;
    if (stream->blockLevel == iVar1) {
      stream->blockLevel = -1;
    }
    if (iVar1 != 0) {
      stream->level = iVar1 + -1;
    }
    if (0 < (long)stream->nbState) {
      lVar2 = (long)stream->nbState + 1;
      do {
        if (stream->states[lVar2 * 2 + -3] <= stream->level) break;
        stream->nbState = stream->nbState + -1;
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
    stream = stream->next;
    if (stream == (_xmlStreamCtxt *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

int
xmlStreamPop(xmlStreamCtxtPtr stream) {
    int i, lev;

    if (stream == NULL)
        return(-1);
    while (stream != NULL) {
	/*
	* Reset block-level.
	*/
	if (stream->blockLevel == stream->level)
	    stream->blockLevel = -1;

	/*
	 *  stream->level can be zero when XML_FINAL_IS_ANY_NODE is set
	 *  (see the thread at
	 *  http://mail.gnome.org/archives/xslt/2008-July/msg00027.html)
	 */
	if (stream->level)
	    stream->level--;
	/*
	 * Check evolution of existing states
	 */
	for (i = stream->nbState -1; i >= 0; i--) {
	    /* discard obsoleted states */
	    lev = stream->states[(2 * i) + 1];
	    if (lev > stream->level)
		stream->nbState--;
	    if (lev <= stream->level)
		break;
	}
	stream = stream->next;
    }
    return(0);
}